

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O2

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>,tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0>
               (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
                *function,anon_class_8_1_8991fb9c *context)

{
  HTTPRequester *this;
  basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *pbVar1;
  long lVar2;
  size_type sVar3;
  int iVar4;
  ErrorResult *pEVar5;
  OutputWorker *this_00;
  basic_streambuf<std::allocator<char>_> *this_01;
  allocator local_1f1;
  base_implementation_type *local_1f0;
  Result result;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  basic_streambuf_ref<std::allocator<char>_> local_1b0;
  _Alloc_hider _Stack_1a8;
  int local_188;
  size_t local_180;
  anon_class_8_1_8991fb9c_for_handler_ local_178;
  
  this = (function->handler_).this;
  iVar4 = this->AsyncRefs;
  this->AsyncRefs = iVar4 + -1;
  if ((function->arg1_)._M_value == 0) {
    if (DAT_0019e060 < 3) {
      local_1b8 = (undefined1  [8])tonk::gateway::ModuleLogger;
      local_1b0.sb_._0_4_ = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1a8);
      std::operator<<((ostream *)&_Stack_1a8,(string *)&DAT_0019e090);
      std::operator<<((ostream *)&_Stack_1a8,"Making HTTP request: ");
      std::operator<<((ostream *)&_Stack_1a8,(string *)this);
      this_00 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_00,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1a8);
      iVar4 = this->AsyncRefs + 1;
    }
    this->AsyncRefs = iVar4;
    local_1b8 = (undefined1  [8])local_1c8;
    result.Error = (ErrorResult *)(this->Request)._M_dataplus._M_p;
    sVar3 = (this->Request)._M_string_length;
    pbVar1 = (this->Socket_TCP)._M_t.
             super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
             .
             super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
             ._M_head_impl;
    local_1f0 = (base_implementation_type *)
                ((long)&(pbVar1->
                        super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
                        ).super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true> +
                8);
    lVar2 = *(long *)&(pbVar1->
                      super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
                      ).super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>;
    local_1c8._0_8_ = this;
    this_01 = (basic_streambuf<std::allocator<char>_> *)asio::asio_handler_allocate(0x60,local_1b8);
    local_1b0.sb_ = this_01;
    asio::detail::reactive_socket_send_op_base<asio::const_buffers_1>::reactive_socket_send_op_base
              ((reactive_socket_send_op_base<asio::const_buffers_1> *)this_01,
               (((implementation_type *)
                ((long)&(pbVar1->
                        super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
                        ).super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true> +
                8))->super_base_implementation_type).socket_,(const_buffers_1 *)&result,0,
               asio::detail::
               reactive_socket_send_op<asio::const_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1608:13)>
               ::do_complete);
    (this_01->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._0_8_;
    _Stack_1a8._M_p = (pointer)this_01;
    asio::detail::reactive_socket_service_base::start_op
              ((reactive_socket_service_base *)(lVar2 + 0x28),local_1f0,1,(reactor_op *)this_01,
               false,true,
               (bool)(sVar3 == 0 &
                     *(state_type *)
                      ((long)&(pbVar1->
                              super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
                              ).
                              super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>
                      + 0xc) >> 4));
    local_1b0.sb_ = (basic_streambuf<std::allocator<char>_> *)0x0;
    _Stack_1a8._M_p = (pointer)0x0;
    asio::detail::
    reactive_socket_send_op<asio::const_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1608:13)>
    ::ptr::~ptr((ptr *)local_1b8);
    this->AsyncRefs = this->AsyncRefs + 1;
    pbVar1 = (this->Socket_TCP)._M_t.
             super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
             .
             super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
             ._M_head_impl;
    std::__cxx11::string::string((string *)&result,"\r\n\r\n",&local_1f1);
    local_1b0.sb_ = &this->TCPStreamBuf;
    local_1b8 = (undefined1  [8])pbVar1;
    std::__cxx11::string::string((string *)&_Stack_1a8,(string *)&result);
    local_188 = 0;
    local_180 = 0;
    local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
    local_178.this = this;
    local_1c8._8_8_ = std::_V2::system_category();
    asio::detail::
    read_until_delim_string_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1629:13)>
    ::operator()((read_until_delim_string_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1629:13)>
                  *)local_1b8,(error_code *)local_1c8,0,1);
    std::__cxx11::string::~string((string *)&_Stack_1a8);
    std::__cxx11::string::~string((string *)&result);
  }
  else {
    (**(code **)(*(long *)(function->arg1_)._M_cat + 0x20))(local_1b8);
    iVar4 = (function->arg1_)._M_value;
    pEVar5 = (ErrorResult *)operator_new(0x38);
    pEVar5->Source = "Connection failed";
    std::__cxx11::string::string((string *)&pEVar5->Description,(string *)local_1b8);
    pEVar5->Type = Asio;
    pEVar5->Code = (long)iVar4;
    result.Error = pEVar5;
    std::__cxx11::string::~string((string *)local_1b8);
    tonk::gateway::HTTPRequester::OnDone(this,&result,0,(char *)0x0,0);
    tonk::Result::~Result(&result);
  }
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}